

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O0

string * __thiscall
ELFIO::section_impl<ELFIO::Elf64_Shdr>::get_name_abi_cxx11_(section_impl<ELFIO::Elf64_Shdr> *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,(string *)(in_RSI + 0x58));
  return in_RDI;
}

Assistant:

std::string
    get_name() const
    {
        return name;
    }